

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

Vector<double,_2> __thiscall mathtool::Vector<double,_2>::normalize(Vector<double,_2> *this)

{
  double dVar1;
  ostream *poVar2;
  Vector<double,_2> *in_RSI;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  Vector<double,_2> VVar7;
  
  this->v[0] = 0.0;
  this->v[1] = 0.0;
  VVar7.v[0] = norm(in_RSI);
  lVar3 = 0;
  lVar4 = 2;
  dVar5 = -0.0;
  do {
    if (lVar3 == 2) {
LAB_00109f75:
      for (; lVar4 != 2; lVar4 = lVar4 + 1) {
        dVar5 = in_RSI->v[lVar4] / VVar7.v[0];
        this->v[lVar4] = dVar5;
      }
      VVar7.v[1] = dVar5;
      return (Vector<double,_2>)VVar7.v;
    }
    dVar1 = in_RSI->v[lVar3];
    dVar6 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar6 = dVar1;
    }
    this->v[lVar3] = dVar1 / VVar7.v[0];
    if (VVar7.v[0] * 10000000000.0 < dVar6) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"! taking the norm of a zero");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      poVar2 = std::operator<<(poVar2," vector");
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar4 = lVar3;
      goto LAB_00109f75;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

Vector<T,D> Vector<T,D>::normalize() const     // normalize
    {
        Vector<T,D> newv;
        T magnitude = norm();
        int i;
        for(i=0; i<D; i++){
            newv.v[i] = v[i] / magnitude;
            if(ABS(v[i]) > magnitude * HUGENUMBER){
                cerr << "! taking the norm of a zero" << D << " vector" << endl;
                break;
            }
        }
        for(; i < D; i++){
            newv.v[i] = v[i] / magnitude;
        }
        return newv;
    }